

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateFastInlineArrayPush(Lowerer *this,Instr *instr)

{
  Opnd *pOVar1;
  Opnd *arrayOpnd;
  Opnd *src;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  LabelInstr *bailOutLabelHelper;
  LabelInstr *target;
  LabelInstr *pLVar5;
  LabelInstr *extraout_RDX;
  LabelInstr *extraout_RDX_00;
  Lowerer *this_00;
  LabelInstr *in_stack_ffffffffffffff98;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  if (instr->m_opcode != InlineArrayPush) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x52f7,"(instr->m_opcode == Js::OpCode::InlineArrayPush)",
                       "instr->m_opcode == Js::OpCode::InlineArrayPush");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pOVar1 = instr->m_dst;
  arrayOpnd = instr->m_src1;
  src = instr->m_src2;
  bailOutLabelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  target = IR::LabelInstr::New(Label,this->m_func,false);
  IR::Instr::InsertAfter(instr,&target->super_Instr);
  this_00 = (Lowerer *)0x176;
  pLVar5 = IR::LabelInstr::New(Label,this->m_func,true);
  bVar3 = ShouldGenerateArrayFastPath(this_00,arrayOpnd,false,false,false);
  if (bVar3) {
    local_34 = (arrayOpnd->m_valueType).field_0;
    bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_34.field_0);
    if ((!bVar3) || (src->m_type != TyVar)) {
      GenerateFastPush(this,arrayOpnd,src,&bailOutLabelHelper->super_Instr,instr,pLVar5,
                       in_stack_ffffffffffffff98,bailOutLabelHelper,pOVar1 != (Opnd *)0x0);
      IR::Instr::InsertBefore(instr,&pLVar5->super_Instr);
      InsertBranch(Br,true,target,&pLVar5->super_Instr);
    }
  }
  local_32 = (arrayOpnd->m_valueType).field_0;
  bVar3 = ValueType::IsLikelyNativeArray((ValueType *)&local_32.field_0);
  pLVar5 = extraout_RDX;
  if (bVar3) {
    LowerOneBailOutKind(this,instr,BailOutConventionalNativeArrayAccessOnly,false,false);
    IR::Instr::InsertAfter(instr,&bailOutLabelHelper->super_Instr);
    InsertBranch(Br,target,&bailOutLabelHelper->super_Instr);
    pLVar5 = extraout_RDX_00;
  }
  GenerateHelperToArrayPushFastPath(this,instr,pLVar5);
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineArrayPush(IR::Instr * instr)
{
    Assert(instr->m_opcode == Js::OpCode::InlineArrayPush);

    IR::Opnd * baseOpnd = instr->GetSrc1();
    IR::Opnd * srcOpnd = instr->GetSrc2();

    bool returnLength = false;
    if(instr->GetDst())
    {
        returnLength = true;
    }

    IR::LabelInstr * bailOutLabelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr->InsertAfter(doneLabel);

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    //Don't Generate fast path according to ShouldGenerateArrayFastPath()
    //AND, Don't Generate fast path if the array is LikelyNative and the element is not specialized
    if(ShouldGenerateArrayFastPath(baseOpnd, false, false, false) &&
        !(baseOpnd->GetValueType().IsLikelyNativeArray() && srcOpnd->IsVar()))
    {
        GenerateFastPush(baseOpnd, srcOpnd, instr, instr, labelHelper, doneLabel, bailOutLabelHelper, returnLength);
        instr->InsertBefore(labelHelper);
        InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);
    }

    if(baseOpnd->GetValueType().IsLikelyNativeArray())
    {
        //Lower IR::BailOutConventionalNativeArrayAccessOnly here.
        LowerOneBailOutKind(instr, IR::BailOutConventionalNativeArrayAccessOnly, false, false);
        instr->InsertAfter(bailOutLabelHelper);
        InsertBranch(Js::OpCode::Br, doneLabel, bailOutLabelHelper);
    }

    GenerateHelperToArrayPushFastPath(instr, bailOutLabelHelper);

}